

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar5;
  int iVar8;
  int *piVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  float *pfVar19;
  long lVar20;
  int iVar21;
  void *pvVar22;
  long lVar23;
  Option *opt_00;
  ulong uVar24;
  int _h;
  float *pfVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  void *pvVar29;
  ulong uVar30;
  void *pvVar31;
  ulong uVar32;
  undefined8 *puVar33;
  ulong uVar34;
  undefined8 *puVar35;
  long lVar36;
  float *pfVar37;
  void *pvVar38;
  void *pvVar39;
  Mat *dst;
  bool bVar40;
  void *pvVar41;
  int _w;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  float fVar49;
  void *local_288;
  void *local_280;
  void *local_278;
  void *local_270;
  void *local_268;
  void *local_260;
  void *local_258;
  float *local_250;
  void *local_248;
  void *local_240;
  undefined1 local_238 [16];
  Mat local_1f8;
  Mat *local_1a8;
  Option *local_1a0;
  Mat local_198;
  undefined1 local_148 [16];
  undefined1 local_138 [4];
  float afStack_134 [3];
  size_t local_128;
  int iStack_120;
  Allocator *local_118;
  int iStack_110;
  int iStack_10c;
  undefined1 auStack_108 [12];
  size_t local_f8;
  Mat *local_f0;
  undefined1 local_e8 [64];
  size_t local_a8;
  float local_98 [4];
  float local_88 [4];
  Option opt_b;
  
  iVar16 = bottom_blob->c;
  uVar3 = top_blob->w;
  uVar6 = top_blob->h;
  auVar43._4_4_ = uVar6;
  auVar43._0_4_ = uVar3;
  iVar8 = top_blob->c;
  piVar9 = bottom_blob->refcount;
  local_198.data = bottom_blob->data;
  local_198.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_198.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_198.elemsize = bottom_blob->elemsize;
  local_198.elempack = bottom_blob->elempack;
  local_198.allocator = bottom_blob->allocator;
  iVar21 = bottom_blob->h;
  iVar15 = bottom_blob->w;
  auVar44._0_4_ = bottom_blob->dims;
  auVar44._4_4_ = bottom_blob->w;
  auVar44._8_4_ = bottom_blob->h;
  auVar44._12_4_ = bottom_blob->d;
  local_198.cstep = bottom_blob->cstep;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + 1;
    UNLOCK();
    iVar15 = bottom_blob->w;
    iVar21 = bottom_blob->h;
  }
  auVar46 = vpcmpeqd_avx(auVar44,auVar44);
  auVar43._8_8_ = 0;
  auVar43 = vpsubd_avx(auVar43,auVar46);
  auVar46 = vpsrld_avx(auVar43,0x1f);
  local_238 = vpaddd_avx(auVar43,auVar46);
  auVar46._8_4_ = 0xfffffffe;
  auVar46._0_8_ = 0xfffffffefffffffe;
  auVar46._12_4_ = 0xfffffffe;
  local_148 = vpand_avx(local_238,auVar46);
  _w = local_148._0_4_;
  _h = local_148._4_4_;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_shader_local_memory = opt->use_shader_local_memory;
  opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  auVar48 = ZEXT1664(opt_b._32_16_);
  local_198.dims = auVar44._0_4_;
  local_198.w = auVar44._4_4_;
  local_198.h = auVar44._8_4_;
  local_198.d = auVar44._12_4_;
  local_198.c = iVar16;
  local_f0 = bias;
  copy_make_border(bottom_blob,&local_198,0,(_h - iVar21) + 2,0,(_w - iVar15) + 2,0,0.0,&opt_b);
  auVar44 = vpsrad_avx(local_238,1);
  local_a8 = 0;
  local_e8._0_8_ = (void *)0x0;
  local_e8._8_4_ = 0;
  local_e8._12_4_ = 0;
  local_e8._16_8_ = 0;
  local_e8._24_4_ = 0;
  local_e8._32_8_ = (Allocator *)0x0;
  local_e8._40_4_ = 0;
  local_e8._44_4_ = 0;
  local_e8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_1a8 = top_blob;
  local_1a0 = opt;
  Mat::create((Mat *)local_e8,auVar44._4_4_ * auVar44._0_4_,0x10,iVar16,4,opt->workspace_allocator);
  opt_00 = local_1a0;
  dst = local_1a8;
  auVar44 = auVar48._0_16_;
  if (0 < (long)local_198.c) {
    uVar18 = (local_198.h - (local_198.h + -2 >> 0x1f)) + -2 >> 1;
    uVar27 = (local_198.w - (local_198.w + -2 >> 0x1f)) + -2 >> 1;
    iVar16 = uVar27 * uVar18;
    uVar34 = 1;
    if (1 < (int)uVar27) {
      uVar34 = (ulong)uVar27;
    }
    uVar30 = 1;
    if (1 < (int)uVar18) {
      uVar30 = (ulong)uVar18;
    }
    local_250 = (float *)((long)local_198.data + 0xc);
    lVar36 = local_e8._16_8_ * local_a8;
    lVar28 = (long)(int)uVar27 * 4;
    local_278 = (void *)(local_e8._0_8_ + (long)iVar16 * 4);
    local_280 = (void *)(local_e8._0_8_ + (long)(iVar16 * 3) * 4);
    local_258 = (void *)local_e8._0_8_;
    local_288 = (void *)(local_e8._0_8_ + (long)(iVar16 * 2) * 4);
    lVar20 = 0;
    do {
      if (3 < local_198.h) {
        local_238._0_8_ = local_288;
        local_270 = local_280;
        uVar32 = 0;
        pfVar19 = local_250;
        pvVar22 = local_278;
        pvVar29 = local_258;
        do {
          if (3 < local_198.w) {
            uVar24 = 0;
            lVar17 = local_238._0_8_;
            pvVar31 = pvVar29;
            pfVar37 = pfVar19;
            pvVar38 = local_270;
            pvVar41 = pvVar22;
            do {
              lVar23 = -0x10;
              pfVar25 = pfVar37;
              do {
                fVar42 = pfVar25[-2];
                fVar49 = pfVar25[-1];
                fVar1 = *pfVar25;
                *(float *)((long)&local_128 + lVar23) = pfVar25[-3] - fVar49;
                *(float *)((long)&local_118 + lVar23) = fVar49 + fVar42;
                *(float *)(auStack_108 + lVar23) = fVar49 - fVar42;
                *(float *)((long)&local_f8 + lVar23) = fVar1 - fVar42;
                pfVar25 = pfVar25 + local_198.w;
                lVar23 = lVar23 + 4;
              } while (lVar23 != 0);
              lVar23 = 0;
              lVar26 = 0;
              do {
                fVar42 = *(float *)(local_138 + lVar26 + 4);
                fVar49 = *(float *)((long)afStack_134 + lVar26 + 4);
                fVar1 = *(float *)((long)afStack_134 + lVar26 + 8) - fVar42;
                auVar48 = ZEXT464((uint)fVar1);
                *(float *)((long)pvVar31 + lVar23) = *(float *)(local_138 + lVar26) - fVar49;
                *(float *)((long)pvVar41 + lVar23) = fVar49 + fVar42;
                *(float *)(lVar17 + lVar23) = fVar49 - fVar42;
                *(float *)((long)pvVar38 + lVar23) = fVar1;
                lVar26 = lVar26 + 0x10;
                lVar23 = lVar23 + (long)(iVar16 * 4) * 4;
              } while (lVar26 != 0x40);
              uVar24 = uVar24 + 1;
              pfVar37 = pfVar37 + 2;
              pvVar31 = (void *)((long)pvVar31 + 4);
              pvVar41 = (void *)((long)pvVar41 + 4);
              pvVar38 = (void *)((long)pvVar38 + 4);
              lVar17 = lVar17 + 4;
            } while (uVar24 != uVar34);
          }
          uVar32 = uVar32 + 1;
          pfVar19 = (float *)((long)pfVar19 + local_198.elemsize * (long)local_198.w * 2);
          pvVar29 = (void *)((long)pvVar29 + lVar28);
          pvVar22 = (void *)((long)pvVar22 + lVar28);
          local_270 = (void *)((long)local_270 + lVar28);
          local_238._0_8_ = local_238._0_8_ + lVar28;
        } while (uVar32 != uVar30);
      }
      auVar44 = auVar48._0_16_;
      lVar20 = lVar20 + 1;
      local_250 = (float *)((long)local_250 + local_198.cstep * local_198.elemsize);
      local_258 = (void *)((long)local_258 + lVar36);
      local_278 = (void *)((long)local_278 + lVar36);
      local_280 = (void *)((long)local_280 + lVar36);
      local_288 = (void *)((long)local_288 + lVar36);
    } while (lVar20 != local_198.c);
  }
  piVar9 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_f8 = 0;
  _local_138 = (void *)0x0;
  afStack_134[1] = 0.0;
  afStack_134[2] = 0.0;
  local_128 = 0;
  iStack_120 = 0;
  local_118 = (Allocator *)0x0;
  iStack_110 = 0;
  iStack_10c = 0;
  auStack_108 = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_sse((Mat *)local_e8,iVar8,kernel_tm,(Mat *)local_138,opt_00);
  local_1f8.cstep = 0;
  local_1f8.data = (void *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize = 0;
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)0x0;
  local_1f8.dims = 0;
  local_1f8.w = 0;
  local_1f8.h = 0;
  local_1f8.d = 0;
  local_1f8.c = 0;
  uVar4 = dst->w;
  uVar7 = dst->h;
  auVar45._4_4_ = uVar7;
  auVar45._0_4_ = uVar4;
  auVar45._8_8_ = 0;
  auVar43 = vpcmpeqd_avx(auVar45,local_148);
  auVar43 = vpmovsxdq_avx(auVar43);
  auVar44 = vpcmpeqd_avx(auVar44,auVar44);
  if (((auVar44 & ~auVar43) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar44 & ~auVar43,0xf)) {
    if (&local_1f8 == dst) {
      iVar16 = 0;
      iVar8 = 0;
      goto LAB_0025bd06;
    }
    piVar9 = dst->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    local_1f8.data = dst->data;
    local_1f8.refcount._0_4_ = SUB84(dst->refcount,0);
    local_1f8.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_1f8.elemsize = dst->elemsize;
    local_1f8.elempack = dst->elempack;
    local_1f8.allocator = dst->allocator;
    uVar10 = dst->dims;
    uVar11 = dst->w;
    uVar12 = dst->h;
    uVar13 = dst->d;
    local_1f8.c = dst->c;
    local_1f8.cstep = dst->cstep;
    local_1f8.dims = uVar10;
    local_1f8.w = uVar11;
    local_1f8.h = uVar12;
    local_1f8.d = uVar13;
    iVar16 = dst->h;
    iVar8 = dst->w;
  }
  else {
    Mat::create(&local_1f8,_w,_h,iVar8,4,opt_00->workspace_allocator);
    iVar16 = local_1f8.h;
    iVar8 = local_1f8.w;
  }
  if (0 < local_1f8.c) {
    pvVar22 = local_f0->data;
    uVar18 = iVar8 / 2;
    iVar21 = uVar18 * (iVar16 / 2);
    local_280 = local_1f8.data;
    lVar28 = local_128 * local_f8;
    local_288 = (void *)((long)_local_138 + (long)iVar21 * 4);
    local_260 = (void *)((long)_local_138 + (long)(iVar21 * 2) * 4);
    local_278 = _local_138;
    local_268 = (void *)((long)_local_138 + (long)(iVar21 * 3) * 4);
    local_148._0_8_ = local_1f8.cstep * local_1f8.elemsize;
    lVar20 = (ulong)uVar18 * 4;
    uVar34 = 0;
    do {
      if (pvVar22 == (void *)0x0) {
        fVar42 = 0.0;
      }
      else {
        fVar42 = *(float *)((long)pvVar22 + uVar34 * 4);
      }
      if (1 < iVar16) {
        local_238._0_8_ = local_280;
        local_270 = local_268;
        local_240 = local_260;
        local_248 = local_288;
        uVar30 = 0;
        pvVar29 = local_278;
        do {
          if (1 < iVar8) {
            uVar32 = 0;
            pvVar31 = local_248;
            pvVar38 = local_270;
            pvVar41 = pvVar29;
            puVar33 = (undefined8 *)local_238._0_8_;
            pvVar39 = local_240;
            do {
              lVar36 = 4;
              lVar17 = 0;
              do {
                fVar49 = *(float *)((long)pvVar31 + lVar17 * 4);
                fVar1 = *(float *)((long)pvVar39 + lVar17 * 4);
                fVar2 = *(float *)((long)pvVar38 + lVar17 * 4);
                local_98[lVar36 + -4] = fVar49 + *(float *)((long)pvVar41 + lVar17 * 4) + fVar1;
                local_98[lVar36] = (fVar49 - fVar1) + fVar2;
                lVar36 = lVar36 + 1;
                lVar17 = lVar17 + iVar21 * 4;
              } while (lVar36 != 8);
              pfVar19 = local_98;
              puVar35 = puVar33;
              bVar14 = true;
              do {
                bVar40 = bVar14;
                fVar49 = (float)*(undefined8 *)(pfVar19 + 2);
                auVar44 = vinsertps_avx(ZEXT416((uint)(fVar42 + pfVar19[1] + *pfVar19)),
                                        ZEXT416((uint)((fVar42 + pfVar19[1]) - fVar49)),0x10);
                auVar47._0_4_ = auVar44._0_4_ + fVar49;
                auVar47._4_4_ = auVar44._4_4_ + (float)((ulong)*(undefined8 *)(pfVar19 + 2) >> 0x20)
                ;
                auVar47._8_4_ = auVar44._8_4_ + 0.0;
                auVar47._12_4_ = auVar44._12_4_ + 0.0;
                uVar5 = vmovlps_avx(auVar47);
                *puVar35 = uVar5;
                puVar35 = (undefined8 *)((long)puVar35 + (long)iVar8 * 4);
                pfVar19 = local_88;
                bVar14 = false;
              } while (bVar40);
              uVar32 = uVar32 + 1;
              pvVar41 = (void *)((long)pvVar41 + 4);
              pvVar31 = (void *)((long)pvVar31 + 4);
              pvVar39 = (void *)((long)pvVar39 + 4);
              pvVar38 = (void *)((long)pvVar38 + 4);
              puVar33 = puVar33 + 1;
            } while (uVar32 != uVar18);
          }
          uVar30 = uVar30 + 1;
          pvVar29 = (void *)((long)pvVar29 + lVar20);
          local_248 = (void *)((long)local_248 + lVar20);
          local_240 = (void *)((long)local_240 + lVar20);
          local_270 = (void *)((long)local_270 + lVar20);
          local_238._0_8_ = local_238._0_8_ + local_1f8.elemsize * (long)iVar8 * 2;
        } while (uVar30 != (uint)(iVar16 / 2));
      }
      uVar34 = uVar34 + 1;
      local_278 = (void *)((long)local_278 + lVar28);
      local_288 = (void *)((long)local_288 + lVar28);
      local_260 = (void *)((long)local_260 + lVar28);
      local_268 = (void *)((long)local_268 + lVar28);
      local_280 = (void *)((long)local_280 + local_1f8.cstep * local_1f8.elemsize);
      opt_00 = local_1a0;
      dst = local_1a8;
    } while (uVar34 != (uint)local_1f8.c);
  }
LAB_0025bd06:
  copy_cut_border(&local_1f8,dst,0,iVar16 - dst->h,0,iVar8 - dst->w,opt_00);
  piVar9 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar9 = (int *)CONCAT44(afStack_134[2],afStack_134[1]);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_118 == (Allocator *)0x0) {
        if (_local_138 != (void *)0x0) {
          free(_local_138);
        }
      }
      else {
        (*local_118->_vptr_Allocator[3])();
      }
    }
  }
  piVar9 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if ((Allocator *)local_e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_e8._0_8_ != (void *)0x0) {
          free((void *)local_e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_e8._32_8_)[3])();
      }
    }
  }
  piVar9 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, 4u, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}